

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_log.cpp
# Opt level: O2

void duckdb::WriteLogFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  LogLevel LVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  BoundFunctionExpression *pBVar5;
  pointer pFVar6;
  reference pvVar7;
  ClientContext *pCVar8;
  Logger *pLVar9;
  type db;
  pointer pCVar10;
  type opener;
  InvalidInputException *this;
  ulong uVar11;
  idx_t i;
  ulong uVar12;
  allocator local_109;
  data_ptr_t local_108;
  DataChunk *local_100;
  Vector *local_f8;
  LogicalType local_f0;
  UnifiedVectorFormat idata;
  Value local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_f8 = result;
  pBVar5 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  pFVar6 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->(&pBVar5->bind_info);
  UnifiedVectorFormat::UnifiedVectorFormat(&idata);
  pvVar7 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  Vector::ToUnifiedFormat(pvVar7,args->count,&idata);
  local_100 = args;
  if (*(char *)&pFVar6[1]._vptr_FunctionData == '\0') {
    local_108 = idata.data;
    if (pFVar6[3]._vptr_FunctionData != (_func_int **)0x0) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pFVar6 + 2);
      bVar3 = ::std::operator==(__lhs,"connection");
      if (!bVar3) {
        bVar3 = ::std::operator==(__lhs,"database");
        if (bVar3) {
          pCVar8 = optional_ptr<duckdb::ClientContext,_true>::operator->
                             ((optional_ptr<duckdb::ClientContext,_true> *)(pFVar6 + 0xb));
          db = shared_ptr<duckdb::DatabaseInstance,_true>::operator*(&pCVar8->db);
          LVar1 = *(LogLevel *)&pFVar6[6]._vptr_FunctionData;
          uVar2 = local_100->count;
          if (pFVar6[8]._vptr_FunctionData == (_func_int **)0x0) {
            for (uVar12 = 0; uVar2 != uVar12; uVar12 = uVar12 + 1) {
              pLVar9 = Logger::Get(db);
              iVar4 = (*pLVar9->_vptr_Logger[2])(pLVar9,pFVar6[7]._vptr_FunctionData,(ulong)LVar1);
              if ((char)iVar4 != '\0') {
                uVar11 = uVar12;
                if ((idata.sel)->sel_vector != (sel_t *)0x0) {
                  uVar11 = (ulong)(idata.sel)->sel_vector[uVar12];
                }
                Logger::WriteLog(pLVar9,(char *)pFVar6[7]._vptr_FunctionData,LVar1,
                                 (string_t *)(local_108 + uVar11 * 0x10));
              }
            }
          }
          else {
            for (uVar12 = 0; uVar2 != uVar12; uVar12 = uVar12 + 1) {
              pLVar9 = Logger::Get(db);
              iVar4 = (*pLVar9->_vptr_Logger[2])(pLVar9,pFVar6[7]._vptr_FunctionData,(ulong)LVar1);
              if ((char)iVar4 != '\0') {
                uVar11 = uVar12;
                if ((idata.sel)->sel_vector != (sel_t *)0x0) {
                  uVar11 = (ulong)(idata.sel)->sel_vector[uVar12];
                }
                Logger::WriteLog(pLVar9,(char *)pFVar6[7]._vptr_FunctionData,LVar1,
                                 (string_t *)(local_108 + uVar11 * 0x10));
              }
            }
          }
        }
        else {
          bVar3 = ::std::operator==(__lhs,"file_opener");
          if (!bVar3) {
            this = (InvalidInputException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_90,
                       "write_log: \'scope\' argument unknown: \'%s\'. Valid values are [connection, database, file_opener]"
                       ,&local_109);
            ::std::__cxx11::string::string((string *)&local_50,(string *)__lhs);
            InvalidInputException::InvalidInputException<std::__cxx11::string>
                      (this,(string *)&local_90,&local_50);
            __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pCVar8 = optional_ptr<duckdb::ClientContext,_true>::operator->
                             ((optional_ptr<duckdb::ClientContext,_true> *)(pFVar6 + 0xb));
          pCVar10 = unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>,_true>::
                    operator->(&pCVar8->client_data);
          opener = unique_ptr<duckdb::FileOpener,_std::default_delete<duckdb::FileOpener>,_true>::
                   operator*(&pCVar10->file_opener);
          LVar1 = *(LogLevel *)&pFVar6[6]._vptr_FunctionData;
          uVar2 = local_100->count;
          if (pFVar6[8]._vptr_FunctionData == (_func_int **)0x0) {
            for (uVar12 = 0; uVar2 != uVar12; uVar12 = uVar12 + 1) {
              pLVar9 = Logger::Get(opener);
              iVar4 = (*pLVar9->_vptr_Logger[2])(pLVar9,pFVar6[7]._vptr_FunctionData,(ulong)LVar1);
              if ((char)iVar4 != '\0') {
                uVar11 = uVar12;
                if ((idata.sel)->sel_vector != (sel_t *)0x0) {
                  uVar11 = (ulong)(idata.sel)->sel_vector[uVar12];
                }
                Logger::WriteLog(pLVar9,(char *)pFVar6[7]._vptr_FunctionData,LVar1,
                                 (string_t *)(local_108 + uVar11 * 0x10));
              }
            }
          }
          else {
            for (uVar12 = 0; uVar2 != uVar12; uVar12 = uVar12 + 1) {
              pLVar9 = Logger::Get(opener);
              iVar4 = (*pLVar9->_vptr_Logger[2])(pLVar9,pFVar6[7]._vptr_FunctionData,(ulong)LVar1);
              if ((char)iVar4 != '\0') {
                uVar11 = uVar12;
                if ((idata.sel)->sel_vector != (sel_t *)0x0) {
                  uVar11 = (ulong)(idata.sel)->sel_vector[uVar12];
                }
                Logger::WriteLog(pLVar9,(char *)pFVar6[7]._vptr_FunctionData,LVar1,
                                 (string_t *)(local_108 + uVar11 * 0x10));
              }
            }
          }
        }
        goto LAB_0186f7e0;
      }
    }
    pCVar8 = optional_ptr<duckdb::ClientContext,_true>::operator*
                       ((optional_ptr<duckdb::ClientContext,_true> *)(pFVar6 + 0xb));
    LVar1 = *(LogLevel *)&pFVar6[6]._vptr_FunctionData;
    uVar2 = local_100->count;
    if (pFVar6[8]._vptr_FunctionData == (_func_int **)0x0) {
      for (uVar12 = 0; uVar2 != uVar12; uVar12 = uVar12 + 1) {
        pLVar9 = Logger::Get(pCVar8);
        iVar4 = (*pLVar9->_vptr_Logger[2])(pLVar9,pFVar6[7]._vptr_FunctionData,(ulong)LVar1);
        if ((char)iVar4 != '\0') {
          uVar11 = uVar12;
          if ((idata.sel)->sel_vector != (sel_t *)0x0) {
            uVar11 = (ulong)(idata.sel)->sel_vector[uVar12];
          }
          Logger::WriteLog(pLVar9,(char *)pFVar6[7]._vptr_FunctionData,LVar1,
                           (string_t *)(local_108 + uVar11 * 0x10));
        }
      }
    }
    else {
      for (uVar12 = 0; uVar2 != uVar12; uVar12 = uVar12 + 1) {
        pLVar9 = Logger::Get(pCVar8);
        iVar4 = (*pLVar9->_vptr_Logger[2])(pLVar9,pFVar6[7]._vptr_FunctionData,(ulong)LVar1);
        if ((char)iVar4 != '\0') {
          uVar11 = uVar12;
          if ((idata.sel)->sel_vector != (sel_t *)0x0) {
            uVar11 = (ulong)(idata.sel)->sel_vector[uVar12];
          }
          Logger::WriteLog(pLVar9,(char *)pFVar6[7]._vptr_FunctionData,LVar1,
                           (string_t *)(local_108 + uVar11 * 0x10));
        }
      }
    }
  }
LAB_0186f7e0:
  if (pFVar6[0xc]._vptr_FunctionData == (_func_int **)0xffffffffffffffff) {
    LogicalType::LogicalType(&local_f0,VARCHAR);
    Value::Value(&local_90,&local_f0);
    Vector::Reference(local_f8,&local_90);
    Value::~Value(&local_90);
    LogicalType::~LogicalType(&local_f0);
  }
  else {
    pvVar7 = vector<duckdb::Vector,_true>::get<true>
                       (&local_100->data,(size_type)pFVar6[0xc]._vptr_FunctionData);
    Vector::Reference(local_f8,pvVar7);
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&idata);
  return;
}

Assistant:

static void WriteLogFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() >= 1);

	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	const auto &info = func_expr.bind_info->Cast<WriteLogBindData>();

	UnifiedVectorFormat idata;
	args.data[0].ToUnifiedFormat(args.size(), idata);

	auto input_data = UnifiedVectorFormat::GetData<string_t>(idata);

	if (!info.disable_logging) {
		if (info.scope.empty() || info.scope == "connection") {
			WriteLogValues<const ClientContext>(*info.context, info.level, input_data, idata.sel, args.size(),
			                                    info.type);
		} else if (info.scope == "database") {
			WriteLogValues<const DatabaseInstance>(*info.context->db, info.level, input_data, idata.sel, args.size(),
			                                       info.type);
		} else if (info.scope == "file_opener") {
			WriteLogValues<const FileOpener>(*info.context->client_data->file_opener, info.level, input_data, idata.sel,
			                                 args.size(), info.type);
		} else {
			throw InvalidInputException(
			    "write_log: 'scope' argument unknown: '%s'. Valid values are [connection, database, file_opener]",
			    info.scope);
		}
	}

	if (info.output_col != DConstants::INVALID_INDEX) {
		result.Reference(args.data[info.output_col]);
	} else {
		result.Reference(Value(LogicalType::VARCHAR));
	}
}